

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O3

void __thiscall LogFile::Start_Log(LogFile *this)

{
  pthread_t Swap_thread;
  pthread_t Write_thread;
  pthread_t local_28;
  pthread_t local_20;
  
  pthread_create(&local_28,(pthread_attr_t *)0x0,LogSwapStart,this);
  pthread_setname_np(local_28,"LogSwapThread");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"LogSwapThread Start",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  pthread_create(&local_20,(pthread_attr_t *)0x0,LogWriteStart,this);
  pthread_setname_np(local_20,"LogWriteThread");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"LogWriteThread Start",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void LogFile::Start_Log()
{
    pthread_t Write_thread;
    pthread_t Swap_thread;
    pthread_create(&Swap_thread,NULL,&LogSwapStart,this);
    pthread_setname_np(Swap_thread,"LogSwapThread");
    cout<<"LogSwapThread Start"<<endl;
    pthread_create(&Write_thread,NULL,&LogWriteStart,this);
    pthread_setname_np(Write_thread,"LogWriteThread");
    cout<<"LogWriteThread Start"<<endl;
}